

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool intersect_uint16_nonempty(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB)

{
  uint16_t *endB;
  uint16_t *endA;
  size_t lenB_local;
  uint16_t *B_local;
  size_t lenA_local;
  uint16_t *A_local;
  
  if ((lenA != 0) && (lenB != 0)) {
    lenB_local = (size_t)B;
    lenA_local = (size_t)A;
    do {
      if (*(ushort *)lenB_local <= *(ushort *)lenA_local) {
        while (*(ushort *)lenB_local < *(ushort *)lenA_local) {
          lenB_local = lenB_local + 2;
          if ((uint16_t *)lenB_local == B + lenB) {
            return false;
          }
        }
        if (*(short *)lenA_local == *(short *)lenB_local) {
          return true;
        }
      }
      lenA_local = lenA_local + 2;
    } while ((uint16_t *)lenA_local != A + lenA);
  }
  return false;
}

Assistant:

bool intersect_uint16_nonempty(const uint16_t *A, const size_t lenA,
                         const uint16_t *B, const size_t lenB) {
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return false;
        }
        while (*A > *B) {
            if (++B == endB) return false;
        }
        if (*A == *B) {
            return true;
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return false;  // NOTREACHED
}